

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O1

void __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getQual(kstream<gzFile_s_*,_FunctorZlib> *this,kseq *seq)

{
  int iVar1;
  FILE *__stream;
  
  __stream = (FILE *)seq;
  iVar1 = getc(this,(FILE *)seq);
  this->c = iVar1;
  if (iVar1 != -1) {
    do {
      if ((seq->seq)._M_string_length <= (seq->qual)._M_string_length) {
        return;
      }
      if (iVar1 - 0x21U < 0x5f) {
        __stream = (FILE *)(ulong)(uint)(int)(char)iVar1;
        std::__cxx11::string::push_back((char)seq + '`');
      }
      iVar1 = getc(this,__stream);
      this->c = iVar1;
    } while (iVar1 != -1);
  }
  return;
}

Assistant:

void getQual(kseq& seq){
        while ((c = this->getc()) != -1 && seq.qual.length() < seq.seq.length()) {
            if (c >= 33 && c <= 127)
                seq.qual += (char)c;
        }
    }